

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_resource_stats.cc
# Opt level: O1

size_t get_num_cores(void)

{
  size_t sVar1;
  
  sVar1 = sysconf(0x54);
  return sVar1;
}

Assistant:

size_t get_num_cores(void) {
    size_t num_cores;
#if defined(WIN32) || defined(_WIN32)
    SYSTEM_INFO sysinfo;
    GetSystemInfo(&sysinfo);
    num_cores = (size_t)sysinfo.dwNumberOfProcessors;
#else
    num_cores = (size_t)sysconf(_SC_NPROCESSORS_ONLN);
#endif

    return num_cores;
}